

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O3

void __thiscall chrono::ChBodyEasySphere::~ChBodyEasySphere(ChBodyEasySphere *this)

{
  ChBody::~ChBody(&this->super_ChBody,&PTR_construction_vtable_24__00b065c0);
  free(*(void **)&this[-1].super_ChBody.bflags);
  return;
}

Assistant:

class ChApi ChBodyEasySphere : public ChBody {
  public:
    /// Create a ChBody with optional sphere visualization and/or collision shape. The sphere is created centered at the
    /// center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasySphere(double radius,                                          ///< radius of the sphere
                     double density,                                         ///< density of the body
                     bool visualize = true,                                  ///< create visualization asset
                     bool collide = false,                                   ///< enable collision
                     std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                     std::shared_ptr<collision::ChCollisionModel> collision_model =
                         chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a sphere visualization and collision shape using the specified collision model type. The
    /// sphere is created centered at the center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasySphere(double radius,                                   ///< radius of the sphere
                     double density,                                  ///< density of the body
                     std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                     collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(double radius,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
}